

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_5db41::FileSystemRootNode::set_executable_flag
          (FileSystemRootNode *this,string *filename)

{
  int iVar1;
  ostream *poVar2;
  allocator local_39;
  string local_38;
  
  iVar1 = chmod((filename->_M_dataplus)._M_p,0x1ed);
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_38,"FileSyst",&local_39);
    poVar2 = GEO::Logger::err(&local_38);
    poVar2 = std::operator<<(poVar2,"Could not change file permissions for:");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return iVar1 == 0;
}

Assistant:

bool set_executable_flag(const std::string& filename) override {
            geo_argused(filename);
            if(::chmod(filename.c_str(), 0755) != 0) {
                Logger::err("FileSyst")
                    << "Could not change file permissions for:"
                    << filename << std::endl;
		return false;
            }
	    return true;
        }